

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapelinear.cpp
# Opt level: O3

void pzshape::TPZShapeLinear::Legendre
               (REAL x,int num,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi,int nderiv)

{
  long lVar1;
  double dVar2;
  long lVar3;
  int iVar4;
  TPZFMatrix<double> *pTVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  REAL value;
  double local_80;
  double local_78;
  int local_6c;
  TPZFMatrix<double> *local_68;
  ulong local_60;
  double local_58;
  REAL local_50;
  double local_48;
  ulong local_40;
  double local_38;
  
  if (0 < num) {
    local_80 = 1.0;
    local_68 = phi;
    local_50 = x;
    (*(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x20])
              (phi,0,0,&local_80);
    local_80 = 0.0;
    (*(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x20])
              (dphi,0,0,&local_80);
    local_60 = (ulong)(uint)nderiv;
    local_6c = nderiv;
    if (1 < nderiv) {
      uVar7 = 1;
      do {
        local_80 = 0.0;
        (*(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x20])(dphi,uVar7,0,&local_80);
        uVar7 = uVar7 + 1;
      } while (local_60 != uVar7);
    }
    iVar4 = local_6c;
    if (num != 1) {
      uVar8 = 1;
      (*(local_68->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0x20])(local_68,1,0,&local_50);
      local_80 = 1.0;
      (*(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x20])
                (dphi,0,1);
      uVar7 = local_60;
      if (1 < iVar4) {
        do {
          local_80 = 0.0;
          (*(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0x20])(dphi,uVar8,1);
          uVar8 = uVar8 + 1;
        } while (uVar7 != uVar8);
      }
      if (2 < num) {
        uVar7 = 2;
        lVar6 = 8;
        lVar9 = 0;
        local_40 = (ulong)(uint)num;
        do {
          pTVar5 = local_68;
          local_78 = (double)((int)uVar7 + -1);
          local_58 = local_78 + local_78 + 1.0;
          local_38 = local_50 * local_58;
          lVar3 = (local_68->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
          if ((lVar3 < (long)uVar7) ||
             ((local_68->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          local_48 = local_68->fElem[uVar7 - 1];
          lVar1 = uVar7 - 2;
          if (lVar3 <= lVar1) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          local_80 = (local_38 * local_48 - local_78 * local_68->fElem[uVar7 - 2]) /
                     (double)(int)uVar7;
          (*(local_68->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x20])(local_68,uVar7,0,&local_80);
          if (((pTVar5->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < (long)uVar7) ||
             ((pTVar5->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar3 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
          if ((lVar3 < 1) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar1)) {
            local_78 = pTVar5->fElem[uVar7 - 1];
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          local_80 = pTVar5->fElem[uVar7 - 1] * local_58 + dphi->fElem[lVar3 * lVar1];
          (*(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0x20])(dphi,0,uVar7);
          if (1 < local_6c) {
            uVar8 = 1;
            do {
              lVar3 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
              if ((lVar3 < (long)uVar8) ||
                 ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < (long)uVar7)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              dVar2 = *(double *)((long)dphi->fElem + uVar8 * 8 + lVar6 * lVar3 + -8);
              if ((lVar3 <= (long)uVar8) ||
                 ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar1)) {
                local_78 = dVar2;
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              local_80 = dVar2 * local_58 +
                         *(double *)((long)dphi->fElem + uVar8 * 8 + lVar3 * lVar9);
              (*(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0x20])(dphi,uVar8,uVar7);
              uVar8 = uVar8 + 1;
            } while (local_60 != uVar8);
          }
          uVar7 = uVar7 + 1;
          lVar6 = lVar6 + 8;
          lVar9 = lVar9 + 8;
        } while (uVar7 != local_40);
      }
    }
  }
  return;
}

Assistant:

void TPZShapeLinear::Legendre(REAL x,int num,TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi, int nderiv){
		
		// Quadratic or higher shape functions
		if (num <= 0) return;
		phi.Put(0, 0, 1.0);
		dphi.Put(0, 0, 0.0);
		
		int ideriv;
		for (ideriv = 1; ideriv < nderiv; ideriv++)
			dphi.Put(ideriv, 0, 0.0);
		
		
		if (num == 1) return;
		
		phi.Put(1, 0, x);
		dphi.Put(0, 1, 1.0);
		
		for (ideriv = 1; ideriv < nderiv; ideriv++)
			dphi.Put(ideriv, 1, 0.0);
		
		int ord;
		//Aqui fica diferente do Chebyshev
		REAL ord_real, value;
		for (ord = 2; ord < num; ord++)
		{
			//casting int ord to REAL ord_real
			ord_real = (REAL)ord;
			//computing the ord_th function
			value    = ( (2.0 * (ord_real - 1.0) + 1.0) * x * phi(ord - 1, 0) - (ord_real - 1.0) * phi(ord - 2 , 0) ) / (ord_real);
			phi.Put(ord, 0, value);
			
			//computing the ord_th function's derivative
			value    = (2.0 * (ord_real - 1.0) + 1.0) * phi(ord - 1, 0) + dphi(0, ord - 2);
			dphi.Put(0, ord, value);
			
			for (ideriv = 1; ideriv < nderiv; ideriv++){
				value = (2.0 * (ord_real - 1.0) + 1.0) * dphi(ideriv - 1, ord - 1) + dphi(ideriv, ord - 2);
				dphi.Put(ideriv, ord, value);	    	 
			}
			
		}
		
#ifdef PZDEBUG
		int printing = 0;
		if (printing){
			cout << "Legendre" << endl;
			for(ord = 0; ord < num; ord++)
			{
				cout << "x = " << x << endl;
				cout << "phi(" << ord << ", 0) = " << phi(ord, 0) << endl;
				cout << "dphi(0, " << ord << " = " << dphi(0, ord) << endl;
				cout << endl;
			}
		}
#endif
		
	}